

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O3

void tcg_gen_bitsel_i64(TCGContext_conflict9 *tcg_ctx,TCGv_i64 d,TCGv_i64 a,TCGv_i64 b,TCGv_i64 c)

{
  TCGTemp *ts;
  uintptr_t o;
  uintptr_t o_1;
  uintptr_t o_2;
  
  ts = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I64,false);
  tcg_gen_op3_tricore(tcg_ctx,INDEX_op_and_i64,(TCGArg)ts,(TCGArg)(b + (long)tcg_ctx),
                      (TCGArg)(a + (long)&tcg_ctx->pool_cur));
  tcg_gen_andc_i64_tricore(tcg_ctx,d,c,a);
  tcg_gen_op3_tricore(tcg_ctx,INDEX_op_or_i64,(TCGArg)(d + (long)tcg_ctx),
                      (TCGArg)(d + (long)tcg_ctx),(TCGArg)ts);
  tcg_temp_free_internal_tricore(tcg_ctx,ts);
  return;
}

Assistant:

static void tcg_gen_bitsel_i64(TCGContext *tcg_ctx, TCGv_i64 d, TCGv_i64 a, TCGv_i64 b, TCGv_i64 c)
{
    TCGv_i64 t = tcg_temp_new_i64(tcg_ctx);

    tcg_gen_and_i64(tcg_ctx, t, b, a);
    tcg_gen_andc_i64(tcg_ctx, d, c, a);
    tcg_gen_or_i64(tcg_ctx, d, d, t);
    tcg_temp_free_i64(tcg_ctx, t);
}